

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::iterate
          (TextureCubeMapArrayColorDepthAttachmentsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference p_Var6;
  __normal_iterator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size_*,_std::vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>_>
  local_28;
  iterator end_iterator;
  iterator texture_size_iterator;
  Functions *gl;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(lVar5 + 0x1c0))(0,0,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glClearColor() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x283);
  (**(code **)(lVar5 + 0x1d0))(0x3f800000);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glClearDepthf() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x286);
  (**(code **)(lVar5 + 0x5e0))(0xb71);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glEnable() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x28a);
  end_iterator = std::
                 vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
                 ::begin(&this->m_resolutions);
  local_28._M_current =
       (_texture_size *)
       std::
       vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
       ::end(&this->m_resolutions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_28,&end_iterator);
    if (!bVar1) break;
    p_Var6 = __gnu_cxx::
             __normal_iterator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size_*,_std::vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>_>
             ::operator*(&end_iterator);
    testNonLayeredRendering(this,p_Var6,false);
    p_Var6 = __gnu_cxx::
             __normal_iterator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size_*,_std::vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>_>
             ::operator*(&end_iterator);
    testNonLayeredRendering(this,p_Var6,true);
    p_Var6 = __gnu_cxx::
             __normal_iterator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size_*,_std::vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>_>
             ::operator*(&end_iterator);
    testLayeredRendering(this,p_Var6,false);
    p_Var6 = __gnu_cxx::
             __normal_iterator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size_*,_std::vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>_>
             ::operator*(&end_iterator);
    testLayeredRendering(this,p_Var6,true);
    __gnu_cxx::
    __normal_iterator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size_*,_std::vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>_>
    ::operator++(&end_iterator);
  }
  if ((this->m_n_invalid_color_checks == 0) && (this->m_n_invalid_depth_checks == 0)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayColorDepthAttachmentsTest::iterate()
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize all ES objects needed to run the test */
	initTest();

	/* Setup clear values */
	gl.clearColor(0.0f /* red */, 0.0f /* green */, 0.0f /* blue */, 0.0f /* alpha */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

	gl.clearDepthf(1.0f /* d */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearDepthf() call failed.");

	/* Enable depth test */
	gl.enable(GL_DEPTH_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed");

	/* Execute tests for each resolution */
	for (_texture_size_vector::iterator texture_size_iterator = m_resolutions.begin(),
										end_iterator		  = m_resolutions.end();
		 end_iterator != texture_size_iterator; ++texture_size_iterator)
	{
		testNonLayeredRendering(*texture_size_iterator, false);
		testNonLayeredRendering(*texture_size_iterator, true);
		testLayeredRendering(*texture_size_iterator, false);
		testLayeredRendering(*texture_size_iterator, true);
	}

	/* Test passes if there were no errors */
	if ((0 != m_n_invalid_color_checks) || (0 != m_n_invalid_depth_checks))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	/* Done */
	return STOP;
}